

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

string * __thiscall
adios2::profiling::Timer::GetShortUnits_abi_cxx11_(string *__return_storage_ptr__,Timer *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->m_TimeUnit < (Hours|Milliseconds)) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Timer::GetShortUnits() const noexcept
{
    std::string units;
    switch (m_TimeUnit)
    {
    case TimeUnit::Microseconds:
        units = "mus";
        break;
    case TimeUnit::Milliseconds:
        units = "ms";
        break;
    case TimeUnit::Seconds:
        units = "s";
        break;
    case TimeUnit::Minutes:
        units = "m";
        break;
    case TimeUnit::Hours:
        units = "h";
        break;
    }
    return units;
}